

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_http_server.c
# Opt level: O0

cio_http_location_handler * alloc_handler_for_callback_test(void *config)

{
  request_test *test;
  dummy_handler *handler;
  void *config_local;
  
  config_local = malloc(0xa8);
  if ((cio_http_location_handler *)config_local == (cio_http_location_handler *)0x0) {
    config_local = (void *)0x0;
  }
  else {
    cio_http_location_handler_init((cio_http_location_handler *)config_local);
    cio_write_buffer_head_init((cio_write_buffer *)((long)config_local + 0x68));
    ((cio_http_location_handler *)config_local)->free = free_dummy_handler;
    ((cio_http_location_handler *)config_local)->on_header_field_name =
         *(cio_http_data_cb_t *)((long)config + 0x38);
    ((cio_http_location_handler *)config_local)->on_header_field_value =
         *(cio_http_data_cb_t *)((long)config + 0x40);
    ((cio_http_location_handler *)config_local)->on_url =
         *(cio_http_data_cb_t *)((long)config + 0x30);
    ((cio_http_location_handler *)config_local)->on_headers_complete =
         *(cio_http_cb_t *)((long)config + 0x48);
    ((cio_http_location_handler *)config_local)->on_body =
         *(cio_http_data_cb_t *)((long)config + 0x50);
    ((cio_http_location_handler *)config_local)->on_message_complete =
         *(cio_http_cb_t *)((long)config + 0x58);
    ((cio_http_location_handler *)config_local)->on_schema = *config;
    ((cio_http_location_handler *)config_local)->on_host = *(cio_http_data_cb_t *)((long)config + 8)
    ;
    ((cio_http_location_handler *)config_local)->on_port =
         *(cio_http_data_cb_t *)((long)config + 0x10);
    ((cio_http_location_handler *)config_local)->on_path =
         *(cio_http_data_cb_t *)((long)config + 0x18);
    ((cio_http_location_handler *)config_local)->on_query =
         *(cio_http_data_cb_t *)((long)config + 0x20);
    ((cio_http_location_handler *)config_local)->on_fragment =
         *(cio_http_data_cb_t *)((long)config + 0x28);
    on_schema_fake.return_val = *(cio_http_cb_return *)((long)config + 0x68);
    on_host_fake.return_val = *(cio_http_cb_return *)((long)config + 0x68);
    on_port_fake.return_val = *(cio_http_cb_return *)((long)config + 0x68);
    on_path_fake.return_val = *(cio_http_cb_return *)((long)config + 0x68);
    on_query_fake.return_val = *(cio_http_cb_return *)((long)config + 0x68);
    on_fragment_fake.return_val = *(cio_http_cb_return *)((long)config + 0x68);
  }
  return (cio_http_location_handler *)config_local;
}

Assistant:

static struct cio_http_location_handler *alloc_handler_for_callback_test(const void *config)
{
	struct dummy_handler *handler = malloc(sizeof(*handler));
	if (cio_unlikely(handler == NULL)) {
		return NULL;
	} else {
		const struct request_test *test = (const struct request_test *)config;
		cio_http_location_handler_init(&handler->handler);
		cio_write_buffer_head_init(&handler->wbh);
		handler->handler.free = free_dummy_handler;
		handler->handler.on_header_field_name = test->on_header_field_name;
		handler->handler.on_header_field_value = test->on_header_field_value;
		handler->handler.on_url = test->on_url;
		handler->handler.on_headers_complete = test->on_header_complete;
		handler->handler.on_body = test->on_body;
		handler->handler.on_message_complete = test->on_message_complete;
		handler->handler.on_schema = test->on_scheme;
		handler->handler.on_host = test->on_host;
		handler->handler.on_port = test->on_port;
		handler->handler.on_path = test->on_path;
		handler->handler.on_query = test->on_query;
		handler->handler.on_fragment = test->on_fragment;

		on_schema_fake.return_val = test->callback_return;
		on_host_fake.return_val = test->callback_return;
		on_port_fake.return_val = test->callback_return;
		on_path_fake.return_val = test->callback_return;
		on_query_fake.return_val = test->callback_return;
		on_fragment_fake.return_val = test->callback_return;

		return &handler->handler;
	}
}